

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall IR::IRBuilder::ret(IRBuilder *this,bool result)

{
  bool bVar1;
  bool local_11;
  _Fwd_list_node_base *local_10;
  
  local_11 = result;
  bVar1 = BasicBlock::isTerminated(this->block_);
  if (!bVar1) {
    std::forward_list<IR::Ret,std::allocator<IR::Ret>>::emplace_front<bool&>
              ((forward_list<IR::Ret,std::allocator<IR::Ret>> *)&this->function_->rets_,&local_11);
    local_10 = (this->function_->rets_).super__Fwd_list_base<IR::Ret,_std::allocator<IR::Ret>_>.
               _M_impl._M_head._M_next + 1;
    std::vector<IR::Stmt*,std::allocator<IR::Stmt*>>::emplace_back<IR::Stmt*>
              ((vector<IR::Stmt*,std::allocator<IR::Stmt*>> *)this->block_,(Stmt **)&local_10);
  }
  return;
}

Assistant:

void IRBuilder::ret(bool result) {
  if (block_->isTerminated()) return;
  function_->rets_.emplace_front(result);
  block_->push_back(&function_->rets_.front());
}